

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mlmvn.cc
# Opt level: O1

bool __thiscall klogic::mlmvn_forward_base::step(mlmvn_forward_base *this)

{
  pointer pvVar1;
  size_t sVar2;
  const_iterator xbeg;
  bool bVar3;
  pointer pmVar4;
  ulong uVar5;
  cvector *pcVar6;
  complex<double> *pcVar7;
  ulong uVar8;
  pointer this_00;
  undefined8 extraout_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  
  uVar5 = (ulong)this->layer;
  pvVar1 = (this->net->neurons).
           super__Vector_base<std::vector<klogic::mvn,_std::allocator<klogic::mvn>_>,_std::allocator<std::vector<klogic::mvn,_std::allocator<klogic::mvn>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar8 = ((long)(this->net->neurons).
                 super__Vector_base<std::vector<klogic::mvn,_std::allocator<klogic::mvn>_>,_std::allocator<std::vector<klogic::mvn,_std::allocator<klogic::mvn>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1 >> 3) *
          -0x5555555555555555;
  bVar3 = true;
  if (uVar5 <= uVar8 && uVar8 - uVar5 != 0) {
    if ((uVar8 - 1 == uVar5) && (this->use_out == true)) {
      pcVar7 = (this->out)._M_current;
    }
    else {
      pcVar7 = (this->to->
               super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>).
               _M_impl.super__Vector_impl_data._M_start;
    }
    pvVar1 = pvVar1 + uVar5;
    this_00 = *(pointer *)
               &(pvVar1->super__Vector_base<klogic::mvn,_std::allocator<klogic::mvn>_>)._M_impl;
    pmVar4 = *(pointer *)
              ((long)&(pvVar1->super__Vector_base<klogic::mvn,_std::allocator<klogic::mvn>_>).
                      _M_impl + 8);
    if (this_00 < pmVar4) {
      sVar2 = this->from_size;
      xbeg._M_current =
           (this->from->
           super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>)._M_impl
           .super__Vector_impl_data._M_start;
      do {
        mvn::output(this_00,xbeg,xbeg._M_current + sVar2);
        *(undefined8 *)pcVar7->_M_value = extraout_XMM0_Qa;
        *(undefined8 *)(pcVar7->_M_value + 8) = in_XMM1_Qa;
        this_00 = this_00 + 1;
        pmVar4 = *(pointer *)
                  ((long)&(pvVar1->super__Vector_base<klogic::mvn,_std::allocator<klogic::mvn>_>).
                          _M_impl + 8);
        pcVar7 = pcVar7 + 1;
      } while (this_00 < pmVar4);
    }
    this->from_size =
         (long)pmVar4 -
         *(long *)&(pvVar1->super__Vector_base<klogic::mvn,_std::allocator<klogic::mvn>_>)._M_impl
         >> 5;
    pcVar6 = &this->layer1;
    if ((long)this->layer == 0) {
      this->from = pcVar6;
      pcVar6 = &this->layer2;
    }
    else if (this->from == pcVar6) {
      this->from = &this->layer2;
    }
    else {
      this->from = pcVar6;
      pcVar6 = &this->layer2;
    }
    this->to = pcVar6;
    uVar5 = (long)this->layer + 1;
    this->layer = (int)uVar5;
    uVar8 = ((long)(this->net->neurons).
                   super__Vector_base<std::vector<klogic::mvn,_std::allocator<klogic::mvn>_>,_std::allocator<std::vector<klogic::mvn,_std::allocator<klogic::mvn>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->net->neurons).
                   super__Vector_base<std::vector<klogic::mvn,_std::allocator<klogic::mvn>_>,_std::allocator<std::vector<klogic::mvn,_std::allocator<klogic::mvn>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
    bVar3 = uVar8 < uVar5 || uVar8 - uVar5 == 0;
  }
  return bVar3;
}

Assistant:

bool klogic::mlmvn_forward_base::step()
{
    // Don't do anything if we've already passed all layers
    if (layer >= net.layers_count())
        return true;

    // Use *from as input to layer neurons
    cvector::const_iterator from_beg = from->begin();
    cvector::const_iterator from_end = from_beg + from_size;

    // use *to or out as output
    cvector::iterator j = (layer == net.layers_count() - 1 && use_out)
        ? out : to->begin();

    const vector<mvn> &layer_neurons = net.neurons[layer];

    for (vector<mvn>::const_iterator i = layer_neurons.begin(); i < layer_neurons.end(); ++i)
        *j++ = i->output(from_beg, from_end);

    // Set up "from" and "to" for the next layer
    from_size = layer_neurons.size();

    if (layer == 0) {
        // for the first layer output is always in layer1
        from = &layer1;
        to = &layer2;
    } else if (from == &layer1) {
        from = &layer2;
        to = &layer1;
    } else {
        from = &layer1;
        to = &layer2;
    }

    return ++layer >= net.layers_count();
}